

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_literals.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressLiterals
                 (void *dst,size_t dstCapacity,void *src,size_t srcSize,void *entropyWorkspace,
                 size_t entropyWorkspaceSize,ZSTD_hufCTables_t *prevHuf,ZSTD_hufCTables_t *nextHuf,
                 ZSTD_strategy strategy,int disableLiteralCompression,int suspectUncompressible,
                 int bmi2)

{
  char *src_00;
  int iVar1;
  size_t sVar2;
  code *pcVar3;
  ulong uVar4;
  ulong uVar5;
  ZSTD_hufCTables_t *dstCapacity_00;
  uint uVar6;
  int iVar7;
  byte bVar8;
  bool bVar9;
  HUF_repeat repeat;
  ZSTD_hufCTables_t *local_48;
  size_t local_40;
  char *local_38;
  
  local_40 = entropyWorkspaceSize;
  local_38 = (char *)src;
  switchD_00b1522a::default(nextHuf,prevHuf,0x810);
  src_00 = local_38;
  if (disableLiteralCompression == 0) {
    repeat = prevHuf->repeatMode;
    iVar1 = 3;
    if ((int)(9 - strategy) < 3) {
      iVar1 = 9 - strategy;
    }
    uVar5 = 6;
    if (repeat != HUF_repeat_valid) {
      uVar5 = 8L << ((byte)iVar1 & 0x3f);
    }
    if (uVar5 <= srcSize) {
      uVar5 = ((ulong)(0x3ff < srcSize) - (ulong)(srcSize < 0x4000)) + 4;
      sVar2 = 0xffffffffffffffba;
      if (uVar5 <= dstCapacity && dstCapacity - uVar5 != 0) {
        local_48 = prevHuf;
        bVar9 = repeat == HUF_repeat_valid;
        bVar8 = 6;
        if (7 < (int)strategy) {
          bVar8 = (char)strategy - 1;
        }
        if (uVar5 == 3 && bVar9 || srcSize < 0x100) {
          pcVar3 = HUF_compress1X_repeat;
        }
        else {
          pcVar3 = HUF_compress4X_repeat;
        }
        uVar4 = (*pcVar3)((long)dst + uVar5,dstCapacity - uVar5,local_38,srcSize,0xff,0xb,
                          entropyWorkspace,local_40,nextHuf,&repeat,
                          (7 < (int)strategy) * '\x02' +
                          (srcSize < 0x401 && (int)strategy < 4) * '\x04' +
                          (suspectUncompressible != 0) * '\b' | bmi2 != 0);
        uVar6 = 3 - (repeat == HUF_repeat_none);
        if (uVar4 - 1 < 0xffffffffffffff88 && uVar4 < (srcSize - (srcSize >> (bVar8 & 0x3f))) - 2) {
          if (uVar4 == 1) {
            if ((srcSize < 8) && (1 < srcSize)) {
              sVar2 = 1;
              do {
                if (src_00[sVar2] != *src_00) goto LAB_0129dc5d;
                sVar2 = sVar2 + 1;
              } while (srcSize != sVar2);
            }
            dstCapacity_00 = local_48;
            switchD_00b1522a::default(nextHuf,local_48,0x810);
            sVar2 = ZSTD_compressRleLiteralsBlock(dst,(size_t)dstCapacity_00,src_00,srcSize);
          }
          else {
LAB_0129dc5d:
            if (repeat == HUF_repeat_none) {
              nextHuf->repeatMode = HUF_repeat_check;
            }
            iVar7 = (int)srcSize;
            iVar1 = (int)uVar4;
            if (uVar5 == 5) {
              *(uint *)dst = iVar1 * 0x400000 + iVar7 * 0x10 | uVar6 | 0xc;
              *(char *)((long)dst + 4) = (char)(uVar4 >> 10);
            }
            else if (uVar5 == 4) {
              *(uint *)dst = iVar1 * 0x40000 + iVar7 * 0x10 | uVar6 | 8;
            }
            else {
              iVar1 = iVar1 * 0x4000 +
                      ((uVar6 | iVar7 * 0x10 + (uint)(uVar5 == 3 && bVar9 || srcSize < 0x100) * 4) ^
                      4);
              *(short *)dst = (short)iVar1;
              *(char *)((long)dst + 2) = (char)((uint)iVar1 >> 0x10);
            }
            sVar2 = uVar4 + uVar5;
          }
        }
        else {
          switchD_00b1522a::default(nextHuf,local_48,0x810);
          sVar2 = ZSTD_noCompressLiterals(dst,dstCapacity,src_00,srcSize);
        }
      }
      return sVar2;
    }
  }
  sVar2 = ZSTD_noCompressLiterals(dst,dstCapacity,local_38,srcSize);
  return sVar2;
}

Assistant:

size_t ZSTD_compressLiterals (
                  void* dst, size_t dstCapacity,
            const void* src, size_t srcSize,
                  void* entropyWorkspace, size_t entropyWorkspaceSize,
            const ZSTD_hufCTables_t* prevHuf,
                  ZSTD_hufCTables_t* nextHuf,
                  ZSTD_strategy strategy,
                  int disableLiteralCompression,
                  int suspectUncompressible,
                  int bmi2)
{
    size_t const lhSize = 3 + (srcSize >= 1 KB) + (srcSize >= 16 KB);
    BYTE*  const ostart = (BYTE*)dst;
    U32 singleStream = srcSize < 256;
    symbolEncodingType_e hType = set_compressed;
    size_t cLitSize;

    DEBUGLOG(5,"ZSTD_compressLiterals (disableLiteralCompression=%i, srcSize=%u, dstCapacity=%zu)",
                disableLiteralCompression, (U32)srcSize, dstCapacity);

    DEBUGLOG(6, "Completed literals listing (%zu bytes)", showHexa(src, srcSize));

    /* Prepare nextEntropy assuming reusing the existing table */
    ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));

    if (disableLiteralCompression)
        return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);

    /* if too small, don't even attempt compression (speed opt) */
    if (srcSize < ZSTD_minLiteralsToCompress(strategy, prevHuf->repeatMode))
        return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);

    RETURN_ERROR_IF(dstCapacity < lhSize+1, dstSize_tooSmall, "not enough space for compression");
    {   HUF_repeat repeat = prevHuf->repeatMode;
        int const flags = 0
            | (bmi2 ? HUF_flags_bmi2 : 0)
            | (strategy < ZSTD_lazy && srcSize <= 1024 ? HUF_flags_preferRepeat : 0)
            | (strategy >= HUF_OPTIMAL_DEPTH_THRESHOLD ? HUF_flags_optimalDepth : 0)
            | (suspectUncompressible ? HUF_flags_suspectUncompressible : 0);

        typedef size_t (*huf_compress_f)(void*, size_t, const void*, size_t, unsigned, unsigned, void*, size_t, HUF_CElt*, HUF_repeat*, int);
        huf_compress_f huf_compress;
        if (repeat == HUF_repeat_valid && lhSize == 3) singleStream = 1;
        huf_compress = singleStream ? HUF_compress1X_repeat : HUF_compress4X_repeat;
        cLitSize = huf_compress(ostart+lhSize, dstCapacity-lhSize,
                                src, srcSize,
                                HUF_SYMBOLVALUE_MAX, LitHufLog,
                                entropyWorkspace, entropyWorkspaceSize,
                                (HUF_CElt*)nextHuf->CTable,
                                &repeat, flags);
        DEBUGLOG(5, "%zu literals compressed into %zu bytes (before header)", srcSize, cLitSize);
        if (repeat != HUF_repeat_none) {
            /* reused the existing table */
            DEBUGLOG(5, "reusing statistics from previous huffman block");
            hType = set_repeat;
        }
    }

    {   size_t const minGain = ZSTD_minGain(srcSize, strategy);
        if ((cLitSize==0) || (cLitSize >= srcSize - minGain) || ERR_isError(cLitSize)) {
            ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
            return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);
    }   }
    if (cLitSize==1) {
        /* A return value of 1 signals that the alphabet consists of a single symbol.
         * However, in some rare circumstances, it could be the compressed size (a single byte).
         * For that outcome to have a chance to happen, it's necessary that `srcSize < 8`.
         * (it's also necessary to not generate statistics).
         * Therefore, in such a case, actively check that all bytes are identical. */
        if ((srcSize >= 8) || allBytesIdentical(src, srcSize)) {
            ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
            return ZSTD_compressRleLiteralsBlock(dst, dstCapacity, src, srcSize);
    }   }

    if (hType == set_compressed) {
        /* using a newly constructed table */
        nextHuf->repeatMode = HUF_repeat_check;
    }

    /* Build header */
    switch(lhSize)
    {
    case 3: /* 2 - 2 - 10 - 10 */
        if (!singleStream) assert(srcSize >= MIN_LITERALS_FOR_4_STREAMS);
        {   U32 const lhc = hType + ((U32)(!singleStream) << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<14);
            MEM_writeLE24(ostart, lhc);
            break;
        }
    case 4: /* 2 - 2 - 14 - 14 */
        assert(srcSize >= MIN_LITERALS_FOR_4_STREAMS);
        {   U32 const lhc = hType + (2 << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<18);
            MEM_writeLE32(ostart, lhc);
            break;
        }
    case 5: /* 2 - 2 - 18 - 18 */
        assert(srcSize >= MIN_LITERALS_FOR_4_STREAMS);
        {   U32 const lhc = hType + (3 << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<22);
            MEM_writeLE32(ostart, lhc);
            ostart[4] = (BYTE)(cLitSize >> 10);
            break;
        }
    default:  /* not possible : lhSize is {3,4,5} */
        assert(0);
    }
    DEBUGLOG(5, "Compressed literals: %u -> %u", (U32)srcSize, (U32)(lhSize+cLitSize));
    return lhSize+cLitSize;
}